

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager_kernel_2.h
# Opt level: O3

node * __thiscall
dlib::
memory_manager_kernel_2<dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::node,_10UL>
::allocate(memory_manager_kernel_2<dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::node,_10UL>
           *this)

{
  node *pnVar1;
  chunk_node *pcVar2;
  node *pnVar3;
  long lVar4;
  node *pnVar5;
  
  pnVar1 = this->next;
  if (pnVar1 == (node *)0x0) {
    pnVar1 = (node *)operator_new(0x3c0);
    *(node **)(pnVar1->item + 0x10) = (node *)0x0;
    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pnVar1->item + 0x18))->
    _M_dataplus)._M_p = (pointer)0x0;
    *(size_type *)(pnVar1->item + 0x20) = 0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)(pnVar1->item + 0x28))->_M_allocated_capacity = 0;
    *(char *)((long)pnVar1 + 0x30) = '\0';
    *(char *)((long)pnVar1 + 0x31) = '\0';
    *(char *)((long)pnVar1 + 0x32) = '\0';
    *(char *)((long)pnVar1 + 0x33) = '\0';
    *(char *)((long)pnVar1 + 0x34) = '\0';
    *(char *)((long)pnVar1 + 0x35) = '\0';
    *(char *)((long)pnVar1 + 0x36) = '\0';
    *(char *)((long)pnVar1 + 0x37) = '\0';
    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pnVar1->item + 0x38))->
    _M_dataplus)._M_p = (pointer)0x0;
    *(size_type *)(pnVar1->item + 0x40) = 0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)(pnVar1->item + 0x48))->_M_allocated_capacity = 0;
    pnVar1->next = (node *)0x0;
    *(node **)(pnVar1->item + 8) = (node *)0x0;
    *(char *)((long)pnVar1 + 0x50) = '\0';
    *(char *)((long)pnVar1 + 0x51) = '\0';
    *(char *)((long)pnVar1 + 0x52) = '\0';
    *(char *)((long)pnVar1 + 0x53) = '\0';
    *(char *)((long)pnVar1 + 0x54) = '\0';
    *(char *)((long)pnVar1 + 0x55) = '\0';
    *(char *)((long)pnVar1 + 0x56) = '\0';
    *(char *)((long)pnVar1 + 0x57) = '\0';
    *(undefined8 *)(pnVar1->item + 0x58) = 0;
    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pnVar1->item + 0x18))->
    _M_dataplus)._M_p = (pointer)(pnVar1->item + 0x28);
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)(pnVar1->item + 0x28))->_M_local_buf[0] = '\0';
    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pnVar1->item + 0x38))->
    _M_dataplus)._M_p = (pointer)(pnVar1->item + 0x48);
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)(pnVar1->item + 0x48))->_M_local_buf[0] = '\0';
    pcVar2 = (chunk_node *)operator_new(0x10);
    pcVar2->chunk = pnVar1;
    pcVar2->next = this->first_chunk;
    this->first_chunk = pcVar2;
    lVar4 = 9;
    pnVar5 = this->next;
    pnVar3 = pnVar1;
    do {
      pnVar3 = pnVar3 + 1;
      pnVar3->next = pnVar5;
      lVar4 = lVar4 + -1;
      pnVar5 = pnVar3;
    } while (lVar4 != 0);
  }
  else {
    pnVar3 = pnVar1->next;
    *(node **)(pnVar1->item + 0x10) = (node *)0x0;
    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pnVar1->item + 0x18))->
    _M_dataplus)._M_p = (pointer)0x0;
    *(size_type *)(pnVar1->item + 0x20) = 0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)(pnVar1->item + 0x28))->_M_allocated_capacity = 0;
    *(char *)((long)pnVar1 + 0x30) = '\0';
    *(char *)((long)pnVar1 + 0x31) = '\0';
    *(char *)((long)pnVar1 + 0x32) = '\0';
    *(char *)((long)pnVar1 + 0x33) = '\0';
    *(char *)((long)pnVar1 + 0x34) = '\0';
    *(char *)((long)pnVar1 + 0x35) = '\0';
    *(char *)((long)pnVar1 + 0x36) = '\0';
    *(char *)((long)pnVar1 + 0x37) = '\0';
    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pnVar1->item + 0x38))->
    _M_dataplus)._M_p = (pointer)0x0;
    *(size_type *)(pnVar1->item + 0x40) = 0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)(pnVar1->item + 0x48))->_M_allocated_capacity = 0;
    *(char *)((long)pnVar1 + 0x50) = '\0';
    *(char *)((long)pnVar1 + 0x51) = '\0';
    *(char *)((long)pnVar1 + 0x52) = '\0';
    *(char *)((long)pnVar1 + 0x53) = '\0';
    *(char *)((long)pnVar1 + 0x54) = '\0';
    *(char *)((long)pnVar1 + 0x55) = '\0';
    *(char *)((long)pnVar1 + 0x56) = '\0';
    *(char *)((long)pnVar1 + 0x57) = '\0';
    *(undefined8 *)(pnVar1->item + 0x58) = 0;
    pnVar1->next = (node *)0x0;
    *(node **)(pnVar1->item + 8) = (node *)0x0;
    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pnVar1->item + 0x18))->
    _M_dataplus)._M_p = (pointer)(pnVar1->item + 0x28);
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)(pnVar1->item + 0x28))->_M_local_buf[0] = '\0';
    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pnVar1->item + 0x38))->
    _M_dataplus)._M_p = (pointer)(pnVar1->item + 0x48);
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)(pnVar1->item + 0x48))->_M_local_buf[0] = '\0';
  }
  this->next = pnVar3;
  this->allocations = this->allocations + 1;
  return (node *)pnVar1;
}

Assistant:

T* allocate (
        ) 
        {              
            T* temp = 0;
            if (next != 0)
            {
                temp = reinterpret_cast<T*>(next);
                node* n = next->next;

                try
                {
                    // construct this new T object with placement new.
                    new (static_cast<void*>(temp))T();
                }
                catch (...)
                {
                    next->next = n;
                    throw;
                }

                next = n;
            }
            else
            {
                // the linked list is empty so we need to allocate some more memory
                node* block = 0;
                block = static_cast<node*>(::operator new (sizeof(node)*chunk_size));

                // the first part of this block can be our new object
                temp = reinterpret_cast<T*>(block);

                try
                {
                    // construct this new T object with placement new.
                    new (static_cast<void*>(temp))T();
                }
                catch (...)
                {
                    // construction of the new object threw so delete the block of memory
                    ::operator delete ( static_cast<void*>(block));
                    throw;
                }

                // allocate a new chunk_node
                chunk_node* chunk;
                try {chunk = new chunk_node; }
                catch (...) 
                { 
                    temp->~T();
                    ::operator delete ( static_cast<void*>(block));
                    throw;
                }

                // add this block into the chunk list
                chunk->chunk = block;
                chunk->next = first_chunk;
                first_chunk = chunk;


                ++block;
                // now add the rest of the block into the linked list of free nodes.
                for (unsigned long i = 0; i < chunk_size-1; ++i)
                {
                    block->next = next;
                    next = block;
                    ++block;
                }

            }


            ++allocations;
            return temp;
        }